

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-context.cpp
# Opt level: O0

ggml_cgraph * __thiscall llama_context::graph_init(llama_context *this)

{
  int32_t iVar1;
  pointer pgVar2;
  llama_context *this_00;
  ggml_cgraph *pgVar3;
  long in_RDI;
  ggml_init_params params;
  
  pgVar2 = (pointer)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                               (in_RDI + 0x338));
  this_00 = (llama_context *)
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x3d9125);
  ggml_init();
  std::unique_ptr<ggml_context,_ggml_context_deleter>::reset
            ((unique_ptr<ggml_context,_ggml_context_deleter> *)this_00,pgVar2);
  pgVar2 = std::unique_ptr<ggml_context,_ggml_context_deleter>::get
                     ((unique_ptr<ggml_context,_ggml_context_deleter> *)this_00);
  iVar1 = graph_max_nodes(this_00);
  pgVar3 = (ggml_cgraph *)ggml_new_graph_custom(pgVar2,(long)iVar1,0);
  return pgVar3;
}

Assistant:

ggml_cgraph * llama_context::graph_init() {
    ggml_init_params params = {
        /*.mem_size   =*/ buf_compute_meta.size(),
        /*.mem_buffer =*/ buf_compute_meta.data(),
        /*.no_alloc   =*/ true,
    };

    ctx_compute.reset(ggml_init(params));

    return ggml_new_graph_custom(ctx_compute.get(), graph_max_nodes(), false);
}